

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_consolebuffer.cpp
# Opt level: O1

void __thiscall FConsoleBuffer::FConsoleBuffer(FConsoleBuffer *this)

{
  uint *puVar1;
  
  this->mLastFont = (FFont *)0x0;
  (this->mConsoleText).Array = (FString *)0x0;
  (this->mConsoleText).Most = 0;
  (this->mConsoleText).Count = 0;
  (this->mBrokenConsoleText).Array = (FBrokenLines **)0x0;
  (this->mBrokenConsoleText).Most = 0;
  (this->mBrokenConsoleText).Count = 0;
  (this->mBrokenStart).Array = (uint *)0x0;
  (this->mBrokenStart).Most = 0;
  (this->mBrokenStart).Count = 0;
  (this->mBrokenLines).Array = (FBrokenLines **)0x0;
  (this->mBrokenLines).Most = 0;
  (this->mBrokenLines).Count = 0;
  *(undefined8 *)&(this->mBrokenLines).Count = 0;
  *(undefined8 *)((long)&this->mLogFile + 4) = 0;
  this->mLastDisplayWidth = -1;
  this->mLastLineNeedsUpdate = false;
  this->mTextLines = 0;
  this->mBufferWasCleared = true;
  TArray<unsigned_int,_unsigned_int>::Grow(&this->mBrokenStart,1);
  (this->mBrokenStart).Array[(this->mBrokenStart).Count] = 0;
  puVar1 = &(this->mBrokenStart).Count;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

FConsoleBuffer::FConsoleBuffer()
{
	mLogFile = NULL;
	mAddType = NEWLINE;
	mLastFont = NULL;
	mLastDisplayWidth = -1;
	mLastLineNeedsUpdate = false;
	mTextLines = 0;
	mBufferWasCleared = true;
	mBrokenStart.Push(0);
}